

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

void ScanAnalyse(fstream *file)

{
  char cVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  size_type sVar11;
  reference pvVar12;
  byte local_6e9;
  __cxx11 local_670 [32];
  __cxx11 local_650 [36];
  int local_62c;
  byte local_625;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620 [3];
  bool flag_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558 [32];
  string local_538 [32];
  __cxx11 local_518 [32];
  __cxx11 local_4f8 [36];
  int local_4d4;
  byte local_4cd;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8 [3];
  bool flag2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488 [32];
  undefined8 local_468;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_460;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_458;
  undefined8 local_450;
  undefined8 local_448;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_440;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  undefined8 local_430;
  undefined8 local_428;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_418;
  undefined8 local_410;
  undefined8 local_408;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  undefined8 local_390;
  byte local_382;
  allocator local_381;
  string local_380 [6];
  bool flag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [32];
  int local_278;
  allocator local_271;
  int state;
  string buffer;
  int iStack_244;
  char ch;
  int length;
  int pos;
  string str;
  ostream local_210 [8];
  ofstream resultFile;
  fstream *file_local;
  
  std::ofstream::ofstream(local_210,"C:\\Code\\C\\clion\\LR1\\token.txt",_S_out);
  poVar7 = std::operator<<((ostream *)&std::cout,"into scan...");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  ScanByChar_abi_cxx11_((fstream *)&length);
  iStack_244 = 0;
  iVar4 = std::__cxx11::string::length();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&state,"",&local_271);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  local_278 = 0;
  while (iStack_244 < iVar4) {
    pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&length);
    cVar1 = *pcVar8;
    std::__cxx11::string::operator=((string *)&state,"");
    bVar2 = IsSpace(cVar1);
    if (bVar2) {
      iStack_244 = iStack_244 + 1;
    }
    else {
      bVar2 = IsDivide(cVar1);
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)&state,cVar1);
        iStack_244 = iStack_244 + 1;
        std::operator+(local_2d8,(char *)&state);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&relatemap_abi_cxx11_,(key_type *)&state);
        std::operator+(local_2b8,local_2d8);
        std::operator+(local_298,(char *)local_2b8);
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)local_298);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_298);
        std::__cxx11::string::~string((string *)local_2b8);
        std::__cxx11::string::~string((string *)local_2d8);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&sortmap_abi_cxx11_,(key_type *)&state);
        std::vector<int,_std::allocator<int>_>::push_back(&list1,pmVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2f8,"NONE",&local_2f9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&list2_abi_cxx11_,(value_type *)local_2f8);
        std::__cxx11::string::~string(local_2f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
        poVar7 = std::operator<<(local_210,(string *)&state);
        std::operator<<(poVar7," ");
      }
      else {
        bVar2 = IsOperate(cVar1);
        if (bVar2) {
          std::__cxx11::string::operator+=((string *)&state,cVar1);
          iVar5 = iStack_244 + 1;
          pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&length);
          cVar1 = *pcVar8;
          bVar2 = IsOperate(cVar1);
          if ((bVar2) && (iVar5 < iVar4)) {
            std::__cxx11::string::operator+=((string *)&state,cVar1);
            iVar5 = iStack_244 + 2;
          }
          iStack_244 = iVar5;
          std::operator+(local_360,(char *)&state);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&relatemap_abi_cxx11_,(key_type *)&state);
          std::operator+(local_340,local_360);
          std::operator+(local_320,(char *)local_340);
          poVar7 = std::operator<<((ostream *)&std::cout,(string *)local_320);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_320);
          std::__cxx11::string::~string((string *)local_340);
          std::__cxx11::string::~string((string *)local_360);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](&sortmap_abi_cxx11_,(key_type *)&state);
          std::vector<int,_std::allocator<int>_>::push_back(&list1,pmVar9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_380,"NONE",&local_381);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&list2_abi_cxx11_,(value_type *)local_380);
          std::__cxx11::string::~string(local_380);
          std::allocator<char>::~allocator((allocator<char> *)&local_381);
          poVar7 = std::operator<<(local_210,(string *)&state);
          std::operator<<(poVar7," ");
        }
        else {
          bVar2 = IsDigit(cVar1);
          if (bVar2) {
            local_278 = 1;
            std::__cxx11::string::operator+=((string *)&state,cVar1);
            local_382 = 1;
            iVar5 = iStack_244;
            while( true ) {
              iStack_244 = iVar5 + 1;
              pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&length);
              cVar1 = *pcVar8;
              bVar2 = IsSpace(cVar1);
              local_6e9 = 0;
              if ((!bVar2) && (local_6e9 = 0, iStack_244 < iVar4)) {
                local_6e9 = local_382;
              }
              if ((local_6e9 & 1) == 0) break;
              std::__cxx11::string::operator+=((string *)&state,cVar1);
              switch(local_278) {
              case 1:
                bVar2 = IsDigit(cVar1);
                if (bVar2) {
                  local_278 = 1;
                  iVar5 = iStack_244;
                }
                else if (cVar1 == '.') {
                  local_278 = 2;
                  iVar5 = iStack_244;
                }
                else if ((cVar1 == 'E') || (cVar1 == 'e')) {
                  local_278 = 4;
                  iVar5 = iStack_244;
                }
                else {
                  local_3a0._M_current = (char *)std::__cxx11::string::end();
                  local_398 = __gnu_cxx::
                              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator-(&local_3a0,1);
                  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                  __normal_iterator<char*>
                            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_390,
                             &local_398);
                  local_3a8 = std::__cxx11::string::erase(&state,local_390);
                  local_382 = 0;
                }
                break;
              case 2:
                bVar2 = IsDigit(cVar1);
                if (bVar2) {
                  local_278 = 3;
                  iVar5 = iStack_244;
                }
                else {
                  local_3c0._M_current = (char *)std::__cxx11::string::end();
                  local_3b8 = __gnu_cxx::
                              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator-(&local_3c0,1);
                  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                  __normal_iterator<char*>
                            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_3b0,
                             &local_3b8);
                  local_3c8 = std::__cxx11::string::erase(&state,local_3b0);
                  local_382 = 0;
                }
                break;
              case 3:
                bVar2 = IsDigit(cVar1);
                if (bVar2) {
                  local_278 = 3;
                  iVar5 = iStack_244;
                }
                else if ((cVar1 == 'E') || (cVar1 == 'e')) {
                  local_278 = 4;
                  iVar5 = iStack_244;
                }
                else {
                  local_3e0._M_current = (char *)std::__cxx11::string::end();
                  local_3d8 = __gnu_cxx::
                              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator-(&local_3e0,1);
                  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                  __normal_iterator<char*>
                            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_3d0,
                             &local_3d8);
                  local_3e8 = std::__cxx11::string::erase(&state,local_3d0);
                  local_382 = 0;
                }
                break;
              case 4:
                if ((cVar1 == '+') || (cVar1 == '-')) {
                  local_278 = 5;
                  iVar5 = iStack_244;
                }
                else {
                  bVar2 = IsDigit(cVar1);
                  if (bVar2) {
                    local_278 = 6;
                    iVar5 = iStack_244;
                  }
                  else {
                    local_400._M_current = (char *)std::__cxx11::string::end();
                    local_3f8 = __gnu_cxx::
                                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator-(&local_400,1);
                    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                    __normal_iterator<char*>
                              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_3f0,
                               &local_3f8);
                    local_408 = std::__cxx11::string::erase(&state,local_3f0);
                    local_382 = 0;
                  }
                }
                break;
              case 5:
                bVar2 = IsDigit(cVar1);
                if (bVar2) {
                  local_278 = 6;
                  iVar5 = iStack_244;
                }
                else {
                  local_420._M_current = (char *)std::__cxx11::string::end();
                  local_418 = __gnu_cxx::
                              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator-(&local_420,1);
                  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                  __normal_iterator<char*>
                            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_410,
                             &local_418);
                  local_428 = std::__cxx11::string::erase(&state,local_410);
                  local_382 = 0;
                }
                break;
              case 6:
                bVar2 = IsDigit(cVar1);
                if (bVar2) {
                  local_278 = 6;
                  iVar5 = iStack_244;
                }
                else {
                  local_440._M_current = (char *)std::__cxx11::string::end();
                  local_438 = __gnu_cxx::
                              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator-(&local_440,1);
                  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                  __normal_iterator<char*>
                            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_430,
                             &local_438);
                  local_448 = std::__cxx11::string::erase(&state,local_430);
                  local_382 = 0;
                }
                break;
              default:
                local_382 = 0;
                local_460._M_current = (char *)std::__cxx11::string::end();
                local_458 = __gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator-(&local_460,1);
                __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                __normal_iterator<char*>
                          ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_450,
                           &local_458);
                local_468 = std::__cxx11::string::erase(&state,local_450);
                poVar7 = std::operator<<((ostream *)&std::cout,"error!");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
            }
            std::operator+(local_4c8,(char *)&state);
            std::operator+(local_4a8,local_4c8);
            std::operator+(local_488,(char *)local_4a8);
            poVar7 = std::operator<<((ostream *)&std::cout,(string *)local_488);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)local_488);
            std::__cxx11::string::~string((string *)local_4a8);
            std::__cxx11::string::~string((string *)local_4c8);
            i = 9;
            std::vector<int,_std::allocator<int>_>::push_back(&list1,&i);
            poVar7 = std::operator<<(local_210,"iConst");
            std::operator<<(poVar7," ");
            local_4cd = 0;
            for (local_4d4 = 0; uVar10 = (ulong)local_4d4,
                sVar11 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(&table_abi_cxx11_), uVar10 < sVar11; local_4d4 = local_4d4 + 1) {
              pvVar12 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](&table_abi_cxx11_,(long)local_4d4);
              _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&state,pvVar12);
              if (_Var3) {
                std::__cxx11::to_string(local_4f8,local_4d4);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&list2_abi_cxx11_,(value_type *)local_4f8);
                std::__cxx11::string::~string((string *)local_4f8);
                local_4cd = 1;
              }
            }
            if ((local_4cd & 1) == 0) {
              std::__cxx11::to_string(local_518,sortNumber);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&list2_abi_cxx11_,(value_type *)local_518);
              std::__cxx11::string::~string((string *)local_518);
              sortNumber = sortNumber + 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&table_abi_cxx11_,(value_type *)&state);
            }
          }
          else {
            bVar2 = IsLetter(cVar1);
            if ((bVar2) || (cVar1 == '_')) {
              std::__cxx11::string::operator+=((string *)&state,cVar1);
              iStack_244 = iStack_244 + 1;
              while( true ) {
                iVar6 = iStack_244 + 1;
                pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&length);
                cVar1 = *pcVar8;
                bVar2 = IsSpace(cVar1);
                iVar5 = iVar6;
                if ((bVar2 || iVar4 <= iVar6) ||
                   (((bVar2 = IsLetter(cVar1), !bVar2 && (cVar1 != '_')) &&
                    (bVar2 = IsDigit(cVar1), iVar5 = iStack_244, !bVar2)))) break;
                std::__cxx11::string::operator+=((string *)&state,cVar1);
                iStack_244 = iVar6;
              }
              iStack_244 = iVar5;
              std::__cxx11::string::string(local_538,(string *)&state);
              bVar2 = IsKeyword((string *)local_538);
              std::__cxx11::string::~string(local_538);
              if (bVar2) {
                std::operator+(local_598,(char *)&state);
                std::operator+(local_578,local_598);
                std::operator+(local_558,(char *)local_578);
                poVar7 = std::operator<<((ostream *)&std::cout,(string *)local_558);
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                std::__cxx11::string::~string((string *)local_558);
                std::__cxx11::string::~string((string *)local_578);
                std::__cxx11::string::~string((string *)local_598);
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         ::operator[](&sortmap_abi_cxx11_,(key_type *)&state);
                std::vector<int,_std::allocator<int>_>::push_back(&list1,pmVar9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_5b8,"NONE",&local_5b9);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&list2_abi_cxx11_,(value_type *)local_5b8);
                std::__cxx11::string::~string(local_5b8);
                std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
                poVar7 = std::operator<<(local_210,(string *)&state);
                std::operator<<(poVar7," ");
              }
              else {
                std::operator+(local_620,(char *)&state);
                std::operator+(local_600,local_620);
                std::operator+(local_5e0,(char *)local_600);
                poVar7 = std::operator<<((ostream *)&std::cout,(string *)local_5e0);
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                std::__cxx11::string::~string((string *)local_5e0);
                std::__cxx11::string::~string((string *)local_600);
                std::__cxx11::string::~string((string *)local_620);
                i_1 = 1;
                std::vector<int,_std::allocator<int>_>::push_back(&list1,&i_1);
                poVar7 = std::operator<<(local_210,"id");
                std::operator<<(poVar7," ");
                local_625 = 0;
                for (local_62c = 0; uVar10 = (ulong)local_62c,
                    sVar11 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size(&table_abi_cxx11_), uVar10 < sVar11; local_62c = local_62c + 1)
                {
                  pvVar12 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[](&table_abi_cxx11_,(long)local_62c);
                  _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&state,pvVar12);
                  if (_Var3) {
                    std::__cxx11::to_string(local_650,local_62c);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(&list2_abi_cxx11_,(value_type *)local_650);
                    std::__cxx11::string::~string((string *)local_650);
                    local_625 = 1;
                  }
                }
                if ((local_625 & 1) == 0) {
                  std::__cxx11::to_string(local_670,sortNumber);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&list2_abi_cxx11_,(value_type *)local_670);
                  std::__cxx11::string::~string((string *)local_670);
                  sortNumber = sortNumber + 1;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&table_abi_cxx11_,(value_type *)&state);
                }
              }
            }
            else {
              local_278 = 1;
              std::__cxx11::string::operator+=((string *)&state,cVar1);
              iStack_244 = iStack_244 + 2;
              pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&length);
              cVar1 = *pcVar8;
              std::__cxx11::string::operator+=((string *)&state,cVar1);
              if (cVar1 == '*') {
                local_278 = 2;
              }
              while (iStack_244 < iVar4 && local_278 != 4) {
                iStack_244 = iStack_244 + 1;
                pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&length);
                cVar1 = *pcVar8;
                std::__cxx11::string::operator+=((string *)&state,cVar1);
                if (local_278 == 2) {
                  if (cVar1 == '*') {
                    local_278 = 3;
                  }
                }
                else if (local_278 == 3) {
                  if (cVar1 == '/') {
                    local_278 = 4;
                  }
                  else if (cVar1 != '*') {
                    local_278 = 2;
                  }
                }
              }
              poVar7 = std::operator<<((ostream *)&std::cout,"annotation:");
              poVar7 = std::operator<<(poVar7,(string *)&state);
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&state);
  std::__cxx11::string::~string((string *)&length);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void ScanAnalyse(fstream &file) {
    ofstream resultFile("C:\\Code\\C\\clion\\LR1\\token.txt");
    cout << "into scan..." << endl;
    string str = ScanByChar(file);
    int pos = 0;
    int length = str.length();
    char ch;
    string buffer = "";
    int state = 0;
    while (pos < length) {
        ch = str[pos];
        buffer = "";
        if (IsSpace(ch)) { pos++; }
        else if (IsDivide(ch)) {
            buffer += ch;
            pos++;
            cout << buffer + "  <" + relatemap[buffer] + ", _>" << endl;
            list1.push_back(sortmap[buffer]);
            list2.push_back("NONE");
            resultFile << buffer << " ";
            //tokenmap.insert( pair<int,string>(sortmap[buffer],"NONE") );
        } else if (IsOperate(ch)) {
            buffer += ch;
            pos++;
            if (IsOperate(ch = str[pos]) && pos < length) {
                buffer += ch;
                pos++;
            } else {
            }
            cout << buffer + "  <" + relatemap[buffer] + ", _>" << endl;
            list1.push_back(sortmap[buffer]);
            list2.push_back("NONE");
            resultFile << buffer << " ";
            //tokenmap.insert( pair<int,string>(sortmap[buffer],"NONE") );
        } else if (IsDigit(ch)) {
            state = 1;
            buffer += ch;
            pos++;
            bool flag = true;
            while (!IsSpace(ch = str[pos]) && pos < length && flag) {
                buffer += ch;
                switch (state) {
                    case 1:
                        if (IsDigit(ch)) state = 1;
                        else if (ch == '.') state = 2;
                        else if (ch == 'E' || ch == 'e') state = 4;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 2:
                        if (IsDigit(ch)) state = 3;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 3:
                        if (IsDigit(ch)) state = 3;
                        else if (ch == 'E' || ch == 'e') state = 4;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 4:
                        if (ch == '+' || ch == '-') state = 5;
                        else if (IsDigit(ch)) state = 6;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 5:
                        if (IsDigit(ch)) state = 6;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 6:
                        if (IsDigit(ch)) state = 6;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    default:
                        pos--;
                        flag = false;
                        buffer.erase(buffer.end() - 1);
                        cout << "error!" << endl;
                        break;
                }
                pos++;
            }
            cout << buffer + " <CONST," + buffer + ">" << endl;
            list1.push_back(9);
            resultFile << "iConst" << " ";
            bool flag2 = false;
            int i = 0;
            for (i = 0; i < table.size(); i++) {
                if (buffer == table[i]) {
                    list2.push_back(to_string(i));
                    flag2 = true;
                }
            }
            if (!flag2) {
                list2.push_back(to_string(sortNumber));
                sortNumber++;
                table.push_back(buffer);
            }
        } else if (IsLetter(ch) || ch == '_') {
            buffer += ch;
            pos++;
            while (!IsSpace(ch = str[pos++]) && pos < length) {
                if (IsLetter(ch) || ch == '_' || IsDigit(ch)) {
                    buffer += ch;
                } else {
                    //fseek(fp,-1L,SEEK_CUR);
                    //fp.seekg(0,ios::cur);
                    pos--;
                    break;
                }
            }
            if (IsKeyword(buffer)) {
                cout << buffer + " <" + buffer + ",_>" << endl;
                list1.push_back(sortmap[buffer]);
                list2.push_back("NONE");
                resultFile << buffer << " ";
            } else {
                cout << buffer + " <IDN," + buffer + ">" << endl;
                list1.push_back(1);
                resultFile << "id" << " ";
                bool flag = false;
                int i = 0;
                for (i = 0; i < table.size(); i++) {
                    if (buffer == table[i]) {
                        list2.push_back(to_string(i));
                        flag = true;
                    }
                }
                if (!flag) {
                    list2.push_back(to_string(sortNumber));
                    sortNumber++;
                    table.push_back(buffer);
                }
            }
        } else if ("/") {
            state = 1;
            buffer += ch;
            pos++;
            ch = str[pos++];
            buffer += ch;
            if (ch == '*') {
                state = 2;
            }
            while (pos < length && state != 4) {
                ch = str[pos++];
                buffer += ch;
                switch (state) {
                    case 2:
                        if (ch == '*') {
                            state = 3;
                        } else {}
                        break;
                    case 3:
                        if (ch == '/') {
                            state = 4;
                        } else if (ch == '*') {
                        } else {
                            state = 2;
                        }
                        break;
                    case 4:
                        break;
                }
            }
            cout << "annotation:" << buffer << endl;
        }
    }
}